

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_if_stmt(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  pointer pWVar1;
  int *piVar2;
  LabelId LVar3;
  LabelId bbFalse;
  ulong uVar4;
  bool bVar5;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  string tmpName;
  anon_class_1_0_00000001 local_141;
  long *local_140;
  long local_138;
  long local_130 [2];
  char local_120;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_118;
  bool local_f8;
  string local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d0;
  bool local_b0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  byte local_88;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  byte local_60;
  RightVal local_58;
  
  this_00 = &this->irGenerator;
  LVar3 = irGenerator::irGenerator::getNewLabelId(this_00);
  bbFalse = irGenerator::irGenerator::getNewLabelId(this_00);
  local_120 = '\0';
  match_one_word(this,IFTK);
  match_one_word(this,LPARENT);
  gm_cond((SyntaxAnalyze *)&local_80._M_first);
  piVar2 = (int *)CONCAT44(local_80._4_4_,local_80._M_first._M_storage);
  match_one_word(this,RPARENT);
  if (*piVar2 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_f0,this_00,Int);
    local_80._M_first._M_storage = (_Uninitialized<int,_true>)piVar2[2];
    local_60 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_80._M_first);
    local_a8._0_8_ = (long)&local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    local_88 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_58,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80._M_first);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_a8._M_first,&local_58);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_58.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              (&local_141,&local_58);
    local_58.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_88]._M_data)
              (&local_141,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8._M_first);
    local_88 = 0xff;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_140,&local_f0);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_60]._M_data)
              (&local_141,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_80._M_first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar2 + 4));
  }
  local_f8 = false;
  bVar5 = local_120 == '\x01';
  if (bVar5) {
    local_118._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_118._M_value + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_140,local_138 + (long)local_140);
  }
  local_f8 = bVar5;
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,LVar3,bbFalse,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_118,Branch);
  if (local_f8 == true) {
    local_f8 = false;
    if (local_118._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_118._M_value + 0x10)) {
      operator_delete((void *)local_118._M_value._M_dataplus._M_p,local_118._16_8_ + 1);
    }
  }
  irGenerator::irGenerator::ir_label(this_00,LVar3);
  gm_stmt(this);
  uVar4 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)(((long)(this->word_list->
                             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                     -0x5555555555555555)) {
    bVar5 = word::Word::match_token(pWVar1 + uVar4,ELSETK);
    if (bVar5) {
      LVar3 = irGenerator::irGenerator::getNewLabelId(this_00);
      local_b0 = false;
      irGenerator::irGenerator::ir_jump
                (this_00,Br,LVar3,-1,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,Branch);
      if (local_b0 == true) {
        local_b0 = false;
        if (local_d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_d0._M_value + 0x10)) {
          operator_delete((void *)local_d0._M_value._M_dataplus._M_p,local_d0._16_8_ + 1);
        }
      }
      irGenerator::irGenerator::ir_label(this_00,bbFalse);
      match_one_word(this,ELSETK);
      gm_stmt(this);
      irGenerator::irGenerator::ir_label(this_00,LVar3);
      goto LAB_001a898a;
    }
  }
  irGenerator::irGenerator::ir_label(this_00,bbFalse);
LAB_001a898a:
  if (local_120 == '\x01') {
    local_120 = '\0';
    if (local_140 != local_130) {
      operator_delete(local_140,local_130[0] + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_if_stmt() {
  SharedExNdPtr cond;
  LabelId ifTrue = irGenerator.getNewLabelId();
  LabelId ifFalse = irGenerator.getNewLabelId();
  std::optional<string> condStr;

  match_one_word(Token::IFTK);

  match_one_word(Token::LPARENT);

  cond = gm_cond();

  match_one_word(Token::RPARENT);

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, ifTrue, ifFalse,
                      condStr, mir::inst::JumpKind::Branch);
  irGenerator.ir_label(ifTrue);

  gm_stmt();

  if (try_word(1, Token::ELSETK)) {
    LabelId ifEnd = irGenerator.getNewLabelId();
    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br, ifEnd, -1,
                        std::nullopt, mir::inst::JumpKind::Branch);
    irGenerator.ir_label(ifFalse);

    match_one_word(Token::ELSETK);
    gm_stmt();

    irGenerator.ir_label(ifEnd);
  } else {
    irGenerator.ir_label(ifFalse);
  }
}